

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O0

float __thiscall
RTIMUBMX055::bmm050_compensate_Z_float(RTIMUBMX055 *this,int16_t mag_data_z,uint16_t data_r)

{
  float local_18;
  float inter_retval;
  uint16_t data_r_local;
  int16_t mag_data_z_local;
  RTIMUBMX055 *this_local;
  
  local_18 = 0.0;
  if (mag_data_z == -0x4000) {
    local_18 = 0.0;
  }
  else if (((this->m_dig_z2 != 0) && (this->m_dig_z1 != 0)) && (data_r != 0)) {
    local_18 = ((((float)(int)mag_data_z - (float)(int)this->m_dig_z4) * 131072.0 -
                (float)(int)this->m_dig_z3 * ((float)data_r - (float)this->m_dig_xyz1)) /
               (((float)(int)this->m_dig_z2 + ((float)this->m_dig_z1 * (float)data_r) / 32768.0) *
               4.0)) / 16.0;
  }
  return local_18;
}

Assistant:

float RTIMUBMX055::bmm050_compensate_Z_float (int16_t mag_data_z, uint16_t data_r)
{
    float inter_retval = BMM050_ZERO_U8X;
     /* no overflow */
    if (mag_data_z != BMM050_HALL_OVERFLOW_ADCVAL) {
        if ((m_dig_z2 != BMM050_ZERO_U8X)
        && (m_dig_z1 != BMM050_ZERO_U8X)
        && (data_r != BMM050_ZERO_U8X)) {
            inter_retval = ((((((float)mag_data_z)-
            ((float)m_dig_z4))*
            BMM050_FLOAT_1_3_1_0_7_2_DATA)-
            (((float)m_dig_z3)*(((float)data_r)
            -((float)m_dig_xyz1))))
            /((((float)m_dig_z2)+
            ((float)m_dig_z1)*((float)data_r) /
            BMM050_FLOAT_3_2_7_6_8_DATA)
            * BMM050_FLOAT_4_DATA))
            / BMM050_FLOAT_SIXTEEN_DATA;
        }
    } else {
        /* overflow, set output to 0.0f */
        inter_retval = BMM050_OVERFLOW_OUTPUT_FLOAT;
    }
    return inter_retval;
}